

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  LodePNGDecoderSettings *zlibsettings;
  LodePNGInfo *info;
  LodePNGColorMode *pLVar1;
  LodePNGColorMode *b;
  byte *data;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  _func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uchar uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uchar *puVar14;
  size_t sVar15;
  size_t sVar16;
  uchar *puVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uchar *out_00;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  byte *chunk;
  long lVar26;
  ulong uVar27;
  size_t bytewidth;
  bool bVar28;
  uchar *local_2c0;
  ulong local_2b8;
  uchar *local_278;
  size_t sStack_270;
  ulong local_268;
  undefined8 local_258;
  ulong local_250;
  size_t *local_248;
  uchar **local_240;
  uint passh [7];
  uint passh_1 [7];
  uint passw_1 [7];
  uint passw [7];
  size_t local_1b8 [8];
  size_t local_178 [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  *out = (uchar *)0x0;
  *out = (uchar *)0x0;
  uVar10 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar10;
  if (uVar10 == 0) {
    lVar26 = (ulong)*h * (ulong)*w;
    if (((*h == 0) || ((int)((ulong)lVar26 >> 0x20) == 0)) && ((uint)lVar26 < 0x10000000)) {
      chunk = in + 0x21;
      pLVar1 = &(state->info_png).color;
      info = &state->info_png;
      zlibsettings = &state->decoder;
      local_240 = (state->info_png).unknown_chunks_data;
      local_248 = (state->info_png).unknown_chunks_size;
      local_258 = 1;
      local_2c0 = (uchar *)0x0;
      uVar21 = 0;
      local_2b8 = 0;
      bVar8 = false;
      bVar6 = false;
      do {
        if ((bVar6) || (state->error != 0)) break;
        if (insize < chunk + (0xc - (long)in) || chunk < in) {
          state->error = 0x1e;
LAB_002c087c:
          iVar13 = 3;
          bVar6 = false;
        }
        else {
          if ((int)((uint)*chunk << 0x18) < 0) {
            state->error = 0x3f;
            goto LAB_002c087c;
          }
          uVar27 = (ulong)((uint)chunk[3] | (uint)chunk[1] << 0x10 | (uint)chunk[2] << 8 |
                          (uint)*chunk << 0x18);
          if ((insize < chunk + (0xc - (long)in) + uVar27) || (chunk + uVar27 + 0xc < in)) {
            state->error = 0x40;
            goto LAB_002c087c;
          }
          data = chunk + 8;
          uVar9 = lodepng_chunk_type_equals(chunk,"IDAT");
          if (uVar9 == '\0') {
            uVar9 = lodepng_chunk_type_equals(chunk,"IEND");
            if (uVar9 != '\0') {
              bVar6 = true;
              bVar7 = false;
              goto LAB_002c0980;
            }
            uVar9 = lodepng_chunk_type_equals(chunk,"PLTE");
            if (uVar9 == '\0') {
              uVar9 = lodepng_chunk_type_equals(chunk,"tRNS");
              if (uVar9 == '\0') {
                uVar9 = lodepng_chunk_type_equals(chunk,"bKGD");
                if (uVar9 == '\0') {
                  uVar9 = lodepng_chunk_type_equals(chunk,"tEXt");
                  if (uVar9 == '\0') {
                    uVar9 = lodepng_chunk_type_equals(chunk,"zTXt");
                    if (uVar9 != '\0') {
                      if ((state->decoder).read_text_chunks == 0) goto LAB_002c0ad2;
                      uVar10 = readChunk_zTXt(info,&zlibsettings->zlibsettings,data,uVar27);
                      goto LAB_002c0b16;
                    }
                    uVar9 = lodepng_chunk_type_equals(chunk,"iTXt");
                    if (uVar9 != '\0') {
                      if ((state->decoder).read_text_chunks == 0) goto LAB_002c0ad2;
                      uVar10 = readChunk_iTXt(info,&zlibsettings->zlibsettings,data,uVar27);
                      goto LAB_002c0b16;
                    }
                    uVar9 = lodepng_chunk_type_equals(chunk,"tIME");
                    if (uVar9 != '\0') {
                      uVar10 = readChunk_tIME(info,data,uVar27);
LAB_002c0b83:
                      state->error = uVar10;
                      bVar6 = false;
                      if (uVar10 == 0) {
                        bVar7 = true;
                        goto LAB_002c0980;
                      }
                      goto LAB_002c0a43;
                    }
                    uVar9 = lodepng_chunk_type_equals(chunk,"pHYs");
                    if (uVar9 != '\0') {
                      uVar10 = readChunk_pHYs(info,data,uVar27);
                      goto LAB_002c0b83;
                    }
                    if ((chunk[4] & 0x20) == 0) {
                      state->error = 0x45;
                      goto LAB_002c0a43;
                    }
                    if ((state->decoder).remember_unknown_chunks == 0) {
                      bVar8 = true;
                      goto LAB_002c0ad2;
                    }
                    uVar10 = (int)local_258 - 1;
                    uVar10 = lodepng_chunk_append(local_240 + uVar10,local_248 + uVar10,chunk);
                    state->error = uVar10;
                    bVar8 = true;
                  }
                  else {
                    if ((state->decoder).read_text_chunks == 0) {
LAB_002c0ad2:
                      bVar6 = false;
                      bVar7 = true;
                      goto LAB_002c0980;
                    }
                    uVar10 = readChunk_tEXt(info,data,uVar27);
LAB_002c0b16:
                    state->error = uVar10;
                  }
                  iVar13 = 3;
                  bVar6 = false;
                  bVar7 = true;
                  if (uVar10 == 0) goto LAB_002c0980;
                  goto LAB_002c0883;
                }
                uVar10 = readChunk_bKGD(info,data,uVar27);
              }
              else {
                uVar10 = readChunk_tRNS(pLVar1,data,uVar27);
              }
              state->error = uVar10;
              if (uVar10 == 0) goto LAB_002c0a50;
            }
            else {
              uVar10 = readChunk_PLTE(pLVar1,data,uVar27);
              state->error = uVar10;
              if (uVar10 == 0) {
                local_258 = 2;
LAB_002c0a50:
                bVar6 = false;
                bVar7 = true;
                goto LAB_002c0980;
              }
            }
LAB_002c0a43:
            bVar6 = false;
            iVar13 = 3;
          }
          else {
            uVar18 = uVar21 + uVar27;
            if (local_2b8 < uVar18) {
              uVar22 = uVar18 * 3 >> 1;
              if (local_2b8 * 2 < uVar18) {
                uVar22 = uVar18;
              }
              local_250 = uVar18;
              puVar14 = (uchar *)realloc(local_2c0,uVar22);
              bVar28 = puVar14 == (uchar *)0x0;
              uVar18 = local_250;
              if (!bVar28) {
                local_2b8 = uVar22;
                local_2c0 = puVar14;
              }
            }
            else {
              bVar28 = false;
            }
            if (bVar28) {
              state->error = 0x53;
              iVar13 = 3;
              uVar18 = uVar21;
            }
            else {
              iVar13 = 0;
              local_258 = 3;
              if (uVar27 != 0) {
                uVar22 = 0;
                do {
                  local_2c0[uVar22 + uVar21] = data[uVar22];
                  uVar22 = uVar22 + 1;
                } while (uVar27 != uVar22);
              }
            }
            uVar21 = uVar18;
            bVar7 = true;
            bVar6 = false;
            if (!bVar28) {
LAB_002c0980:
              if (((state->decoder).ignore_crc != 0 || bVar8) ||
                 (uVar10 = lodepng_chunk_check_crc(chunk), uVar10 == 0)) {
                iVar13 = 0;
                if (bVar7) {
                  iVar11 = swap_bytes(*(undefined4 *)chunk);
                  chunk = chunk + (iVar11 + 0xc);
                }
              }
              else {
                state->error = 0x39;
                iVar13 = 3;
                bVar8 = false;
              }
            }
          }
        }
LAB_002c0883:
      } while (iVar13 == 0);
      local_278 = (uchar *)0x0;
      sStack_270 = 0;
      local_268 = 0;
      uVar10 = *w;
      if ((state->info_png).interlace_method == 0) {
        uVar12 = *h;
        sVar16 = lodepng_get_raw_size_idat(uVar10,uVar12,pLVar1);
        uVar27 = sVar16 + uVar12;
      }
      else {
        uVar12 = *h;
        uVar19 = uVar12 + 7 >> 3;
        sVar16 = lodepng_get_raw_size_idat(uVar10 + 7 >> 3,uVar19,pLVar1);
        lVar26 = sVar16 + uVar19;
        if (4 < uVar10) {
          sVar16 = lodepng_get_raw_size_idat(uVar10 + 3 >> 3,uVar19,pLVar1);
          lVar26 = lVar26 + (ulong)uVar19 + sVar16;
        }
        uVar19 = uVar12 + 3 >> 3;
        sVar16 = lodepng_get_raw_size_idat(uVar10 + 3 >> 2,uVar19,pLVar1);
        lVar26 = uVar19 + sVar16 + lVar26;
        if (2 < uVar10) {
          uVar19 = uVar12 + 3 >> 2;
          sVar16 = lodepng_get_raw_size_idat(uVar10 + 1 >> 2,uVar19,pLVar1);
          lVar26 = lVar26 + uVar19 + sVar16;
        }
        uVar19 = uVar12 + 1 >> 2;
        sVar16 = lodepng_get_raw_size_idat(uVar10 + 1 >> 1,uVar19,pLVar1);
        lVar26 = uVar19 + sVar16 + lVar26;
        if (1 < uVar10) {
          uVar19 = uVar12 + 1 >> 1;
          sVar16 = lodepng_get_raw_size_idat(uVar10 >> 1,uVar19,pLVar1);
          lVar26 = lVar26 + uVar19 + sVar16;
        }
        sVar16 = lodepng_get_raw_size_idat(uVar10,uVar12 >> 1,pLVar1);
        uVar27 = sVar16 + (uVar12 >> 1) + lVar26;
      }
      puVar14 = local_278;
      uVar18 = local_268;
      if ((state->error == 0) && (local_268 < uVar27)) {
        uVar18 = uVar27 * 3 >> 1;
        if (local_268 * 2 < uVar27) {
          uVar18 = uVar27;
        }
        puVar14 = (uchar *)realloc(local_278,uVar18);
        if (puVar14 == (uchar *)0x0) {
          state->error = 0x53;
          puVar14 = local_278;
          uVar18 = local_268;
        }
      }
      local_268 = uVar18;
      local_278 = puVar14;
      if (state->error == 0) {
        p_Var5 = (state->decoder).zlibsettings.custom_zlib;
        if (p_Var5 == (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr
                       *)0x0) {
          uVar10 = lodepng_zlib_decompress
                             (&local_278,&sStack_270,local_2c0,uVar21,&zlibsettings->zlibsettings);
        }
        else {
          uVar10 = (*p_Var5)(&local_278,&sStack_270,local_2c0,uVar21,&zlibsettings->zlibsettings);
        }
        state->error = uVar10;
        uVar12 = 0x5b;
        if (sStack_270 == uVar27) {
          uVar12 = uVar10;
        }
        if (uVar10 != 0) {
          uVar12 = uVar10;
        }
        state->error = uVar12;
      }
      free(local_2c0);
      if (state->error == 0) {
        sVar16 = lodepng_get_raw_size(*w,*h,pLVar1);
        puVar14 = (uchar *)malloc(sVar16);
        *out = puVar14;
        if (puVar14 == (uchar *)0x0) {
          state->error = 0x53;
        }
      }
      else {
        sVar16 = 0;
      }
      puVar14 = local_278;
      if (state->error == 0) {
        if (sVar16 != 0) {
          sVar15 = 0;
          do {
            (*out)[sVar15] = '\0';
            sVar15 = sVar15 + 1;
          } while (sVar16 != sVar15);
        }
        uVar21 = (ulong)(state->info_png).color.colortype;
        iVar13 = 0;
        if (uVar21 < 7) {
          iVar13 = *(int *)(&DAT_00889384 + uVar21 * 4);
        }
        uVar10 = iVar13 * (state->info_png).color.bitdepth;
        if (uVar10 == 0) {
          uVar12 = 0x1f;
        }
        else {
          puVar17 = *out;
          uVar19 = *w;
          uVar24 = *h;
          if ((state->info_png).interlace_method == 0) {
            if (uVar10 < 8) {
              uVar25 = uVar10 * uVar19;
              uVar20 = uVar25 + 7 & 0xfffffff8;
              if (uVar25 == uVar20) goto LAB_002c103c;
              uVar12 = unfilter(local_278,local_278,uVar19,uVar24,uVar10);
              if (uVar12 != 0) goto LAB_002c12b7;
              removePaddingBits(puVar17,puVar14,(ulong)uVar25,(ulong)uVar20,uVar24);
            }
            else {
LAB_002c103c:
              uVar12 = unfilter(puVar17,local_278,uVar19,uVar24,uVar10);
              if (uVar12 != 0) goto LAB_002c12b7;
            }
LAB_002c12ab:
            uVar12 = 0;
          }
          else {
            Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,local_178,uVar19,
                                uVar24,uVar10);
            out_00 = puVar14 + padded_passstart[0];
            uVar12 = unfilter(out_00,puVar14 + filter_passstart[0],passw[0],passh[0],uVar10);
            if (uVar12 == 0) {
              local_2c0._0_4_ = passh[0];
              lVar26 = 0;
              uVar25 = passw[0];
              do {
                if (uVar10 < 8) {
                  removePaddingBits(puVar14 + *(long *)((long)local_178 + lVar26 * 2),out_00,
                                    (ulong)(uVar25 * uVar10),
                                    (ulong)(uVar25 * uVar10 + 7 & 0xfffffff8),(uint)local_2c0);
                }
                if (lVar26 == 0x18) {
                  Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,
                                      local_1b8,uVar19,uVar24,uVar10);
                  if (uVar10 < 8) {
                    lVar26 = 0;
                    do {
                      uVar12 = passh_1[lVar26];
                      if (uVar12 != 0) {
                        uVar24 = passw_1[lVar26];
                        uVar25 = 0;
                        do {
                          if ((ulong)uVar24 != 0) {
                            sVar16 = local_1b8[lVar26];
                            uVar20 = ADAM7_DY[lVar26];
                            uVar2 = ADAM7_IY[lVar26];
                            uVar3 = ADAM7_DX[lVar26];
                            uVar4 = ADAM7_IX[lVar26];
                            uVar21 = 0;
                            do {
                              uVar18 = (ulong)((uVar3 * (int)uVar21 +
                                               (uVar20 * uVar25 + uVar2) * uVar19 + uVar4) * uVar10)
                              ;
                              uVar27 = (ulong)((uVar25 * uVar24 + (int)uVar21) * uVar10) +
                                       sVar16 * 8;
                              uVar23 = uVar10;
                              do {
                                if ((puVar14[uVar27 >> 3] >> (~(byte)uVar27 & 7) & 1) != 0) {
                                  puVar17[uVar18 >> 3] =
                                       puVar17[uVar18 >> 3] | '\x01' << (~(byte)uVar18 & 7);
                                }
                                uVar18 = uVar18 + 1;
                                uVar27 = uVar27 + 1;
                                uVar23 = uVar23 - 1;
                              } while (uVar23 != 0);
                              uVar21 = uVar21 + 1;
                            } while (uVar21 != uVar24);
                          }
                          uVar25 = uVar25 + 1;
                        } while (uVar25 != uVar12);
                      }
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != 7);
                  }
                  else {
                    uVar21 = (ulong)(uVar10 >> 3);
                    lVar26 = 0;
                    do {
                      uVar10 = passh_1[lVar26];
                      if (uVar10 != 0) {
                        uVar12 = passw_1[lVar26];
                        uVar27 = 0;
                        uVar24 = 0;
                        do {
                          iVar13 = (int)uVar27;
                          if ((ulong)uVar12 != 0) {
                            uVar25 = ADAM7_DX[lVar26];
                            uVar20 = (ADAM7_DY[lVar26] * uVar24 + ADAM7_IY[lVar26]) * uVar19 +
                                     ADAM7_IX[lVar26];
                            sVar16 = local_1b8[lVar26];
                            uVar18 = 0;
                            do {
                              uVar22 = 0;
                              do {
                                puVar17[uVar22 + uVar20 * uVar21] =
                                     puVar14[uVar22 + uVar27 * uVar21 + sVar16];
                                uVar22 = uVar22 + 1;
                              } while (uVar21 != uVar22);
                              uVar18 = uVar18 + 1;
                              uVar20 = uVar20 + uVar25;
                              uVar27 = (ulong)((int)uVar27 + 1);
                            } while (uVar18 != uVar12);
                          }
                          uVar24 = uVar24 + 1;
                          uVar27 = (ulong)(iVar13 + uVar12);
                        } while (uVar24 != uVar10);
                      }
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != 7);
                  }
                  goto LAB_002c12ab;
                }
                out_00 = puVar14 + *(long *)((long)padded_passstart + lVar26 * 2 + 8);
                uVar25 = *(uint *)((long)passw + lVar26 + 4);
                local_2c0._0_4_ = *(uint *)((long)passh + lVar26 + 4);
                uVar12 = unfilter(out_00,puVar14 + *(long *)((long)filter_passstart + lVar26 * 2 + 8
                                                            ),uVar25,(uint)local_2c0,uVar10);
                lVar26 = lVar26 + 4;
              } while (uVar12 == 0);
            }
          }
        }
LAB_002c12b7:
        state->error = uVar12;
      }
      sStack_270 = 0;
      local_268 = 0;
      free(local_278);
      local_278 = (uchar *)0x0;
    }
    else {
      state->error = 0x5c;
    }
  }
  if (state->error != 0) {
    return state->error;
  }
  uVar10 = (state->decoder).color_convert;
  if (uVar10 != 0) {
    pLVar1 = &state->info_raw;
    b = &(state->info_png).color;
    iVar13 = lodepng_color_mode_equal(pLVar1,b);
    if (iVar13 == 0) {
      puVar14 = *out;
      if (((pLVar1->colortype | LCT_GREY_ALPHA) != LCT_RGBA) && ((state->info_raw).bitdepth != 8)) {
        return 0x38;
      }
      uVar10 = *w;
      uVar12 = *h;
      sVar16 = lodepng_get_raw_size(uVar10,uVar12,pLVar1);
      puVar17 = (uchar *)malloc(sVar16);
      *out = puVar17;
      if (puVar17 == (uchar *)0x0) {
        uVar10 = 0x53;
      }
      else {
        uVar10 = lodepng_convert(puVar17,puVar14,pLVar1,b,uVar10,uVar12);
      }
      state->error = uVar10;
      free(puVar14);
      goto LAB_002c13bf;
    }
    if (uVar10 != 0) goto LAB_002c13bf;
  }
  uVar10 = lodepng_color_mode_copy(&state->info_raw,&(state->info_png).color);
  state->error = uVar10;
  if (uVar10 != 0) {
    return uVar10;
  }
LAB_002c13bf:
  return state->error;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
                        LodePNGState* state,
                        const unsigned char* in, size_t insize)
{
  *out = 0;
  decodeGeneric(out, w, h, state, in, insize);
  if(state->error) return state->error;
  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color))
  {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert)
    {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
  }
  else
  {
    /*color conversion needed; sort of copy of the data*/
    unsigned char* data = *out;
    size_t outsize;

    /*TODO: check if this works according to the statement in the documentation: "The converter can convert
    from greyscale input color type, to 8-bit greyscale or greyscale with alpha"*/
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
       && !(state->info_raw.bitdepth == 8))
    {
      return 56; /*unsupported color mode conversion*/
    }

    outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!(*out))
    {
      state->error = 83; /*alloc fail*/
    }
    else state->error = lodepng_convert(*out, data, &state->info_raw,
                                        &state->info_png.color, *w, *h);
    lodepng_free(data);
  }
  return state->error;
}